

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

Instr * __thiscall
LowererMD::ChangeToHelperCall
          (LowererMD *this,Instr *callInstr,JnHelperMethod helperMethod,LabelInstr *labelBailOut,
          Opnd *opndBailOutArg,PropertySymOpnd *propSymOpnd,bool isHelperContinuation)

{
  uint32 bailOutOffset;
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  BailOutKind BVar5;
  uint uVar6;
  uint functionId;
  undefined4 *puVar7;
  HelperCallOpnd *this_00;
  Var address;
  AddrOpnd *opndArg;
  Instr *pIVar8;
  BailOutInfo *pBVar9;
  BailOutRecord *this_01;
  JITTimeFunctionBody *this_02;
  FunctionJITTimeInfo *this_03;
  BailOutInfo *local_58;
  Instr *local_40;
  Instr *callInstr_local;
  
  local_40 = callInstr;
  bVar3 = IR::Instr::HasLazyBailOut(callInstr);
  if ((bVar3) && (bVar3 = HelperMethodAttributes::CanBeReentrant(helperMethod), !bVar3)) {
    IR::Instr::ClearLazyBailOut(callInstr);
  }
  bVar3 = IR::Instr::HasLazyBailOut(callInstr);
  if (((bVar3) && (bVar3 = IR::Instr::HasPreOpBailOut(callInstr), bVar3)) &&
     (BVar5 = IR::Instr::GetBailOutKind(callInstr),
     (BVar5 & ~(BailOutKindBits|BailOutIntOnly)) != BailOutOnImplicitCalls)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x2c0,"(false)","Not implemented");
    if (!bVar3) goto LAB_0064f2d3;
    *puVar7 = 0;
  }
  callInstr_local._7_1_ = IR::Instr::HasLazyBailOut(callInstr);
  if ((callInstr->field_0x38 & 0x10) == 0) {
    local_58 = (BailOutInfo *)0x0;
  }
  else {
    local_58 = IR::Instr::GetBailOutInfo(callInstr);
  }
  Lowerer::ReconcileWithLowererStateOnHelperCall(this->m_lowerer,callInstr,helperMethod);
  pIVar8 = callInstr;
  if ((callInstr->field_0x38 & 0x10) != 0) {
    BVar5 = IR::Instr::GetBailOutKind(callInstr);
    if ((BVar5 == BailOutOnPowIntIntOverflow) || (BVar5 == BailOutOnNotPrimitive)) {
      pIVar8 = IR::Instr::New(callInstr->m_opcode,callInstr->m_func);
      local_40 = pIVar8;
      IR::Instr::TransferTo(callInstr,pIVar8);
      IR::Instr::InsertBefore(callInstr,pIVar8);
      callInstr->m_opcode = BVar5 == BailOutOnNotPrimitive ^ BailOnPowIntIntOverflow;
      if (callInstr->m_src1 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
        if (!bVar3) goto LAB_0064f2d3;
        *puVar7 = 0;
      }
      pFVar1 = callInstr->m_func;
      if (opndBailOutArg->isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar3) goto LAB_0064f2d3;
        *puVar7 = 0;
      }
      bVar4 = opndBailOutArg->field_0xb;
      if ((bVar4 & 2) != 0) {
        opndBailOutArg = IR::Opnd::Copy(opndBailOutArg,pFVar1);
        bVar4 = opndBailOutArg->field_0xb;
      }
      opndBailOutArg->field_0xb = bVar4 | 2;
      callInstr->m_src1 = opndBailOutArg;
    }
    else if ((BVar5 & ~(BailOutKindBits|BailOutIntOnly)) == BailOutOnImplicitCalls) {
      callInstr = Lowerer::SplitBailOnImplicitCall(this->m_lowerer,&local_40);
      pIVar8 = local_40;
    }
    else if (-1 < (int)BVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x2e2,"(BailOutInfo::HasLazyBailOut(bailOutKind))",
                         "Unexpected BailOutKind, are we adding new BailOutKind on instructions?");
      if (!bVar3) goto LAB_0064f2d3;
      *puVar7 = 0;
    }
  }
  pIVar8->m_opcode = CALL;
  this_00 = Lowerer::CreateHelperCallOpnd
                      (helperMethod,(this->lowererMDArch).helperCallArgsCount,this->m_func);
  bVar3 = IR::HelperCallOpnd::IsDiagHelperCallOpnd(this_00);
  pIVar8 = local_40;
  if (bVar3) {
    address = (Var)IR::GetMethodOriginalAddress(this->m_func->m_threadContextInfo,helperMethod);
    opndArg = IR::AddrOpnd::New(address,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0);
    LowererMDArch::LoadHelperArgument(&this->lowererMDArch,pIVar8,&opndArg->super_Opnd);
    Lowerer::LoadScriptContext(this->m_lowerer,local_40);
  }
  pIVar8 = local_40;
  if (local_40->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_0064f2d3;
    *puVar7 = 0;
  }
  pFVar1 = pIVar8->m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_0064f2d3;
    *puVar7 = 0;
  }
  bVar4 = (this_00->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_00 = (HelperCallOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
    bVar4 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar4 | 2;
  pIVar8->m_src1 = &this_00->super_Opnd;
  pIVar8 = LowererMDArch::LowerCall(&this->lowererMDArch,local_40,0);
  if (callInstr != local_40) {
    if ((callInstr->m_opcode & ~ExtendedOpcodePrefix) == BailOnNotPrimitive) {
      Lowerer::LowerBailOnTrue(this->m_lowerer,callInstr,labelBailOut);
    }
    else if (callInstr->m_opcode == BailOnNotEqual) {
      BVar5 = IR::Instr::GetBailOutKind(callInstr);
      if ((BVar5 & ~(BailOutKindBits|BailOutIntOnly)) != BailOutOnImplicitCalls) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x300,
                           "(BailOutInfo::IsBailOutOnImplicitCalls(bailOutInstr->GetBailOutKind()))"
                           ,"BailOutInfo::IsBailOutOnImplicitCalls(bailOutInstr->GetBailOutKind())")
        ;
        if (!bVar3) goto LAB_0064f2d3;
        *puVar7 = 0;
      }
      Lowerer::LowerBailOnEqualOrNotEqual
                (this->m_lowerer,callInstr,(BranchInstr *)0x0,labelBailOut,propSymOpnd,
                 isHelperContinuation);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x305,"(false)","Unexpected OpCode for BailOutInstruction");
      if (!bVar3) goto LAB_0064f2d3;
      *puVar7 = 0;
    }
    if (callInstr_local._7_1_ == '\0') goto LAB_0064f26e;
    if (local_58 == (BailOutInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x319,"(bailOutInfo != nullptr)","bailOutInfo != nullptr");
      if (!bVar3) goto LAB_0064f2d3;
      *puVar7 = 0;
    }
    if ((local_40->field_0x38 & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x31a,"(!callInstr->HasBailOutInfo())","!callInstr->HasBailOutInfo()");
      if (!bVar3) goto LAB_0064f2d3;
      *puVar7 = 0;
    }
    if (local_40->m_opcode != CALL) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x31b,"(callInstr->m_opcode == Js::OpCode::CALL)",
                         "callInstr->m_opcode == Js::OpCode::CALL");
      if (!bVar3) goto LAB_0064f2d3;
      *puVar7 = 0;
    }
    local_40 = IR::Instr::ConvertToBailOutInstrWithBailOutInfoCopy(local_40,local_58,LazyBailOut);
    if (((local_40->field_0x38 & 0x10) == 0) ||
       (pBVar9 = IR::Instr::GetBailOutInfo(local_40), pBVar9 == local_58)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,799,
                         "(callInstr->HasBailOutInfo() && callInstr->GetBailOutInfo() != bailOutInfo)"
                         ,
                         "callInstr->HasBailOutInfo() && callInstr->GetBailOutInfo() != bailOutInfo"
                        );
      if (!bVar3) {
LAB_0064f2d3:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    pBVar9 = IR::Instr::GetBailOutInfo(local_40);
    this_01 = (BailOutRecord *)
              new<NativeCodeData::AllocatorT<BailOutRecord>>
                        (0x60,(AllocatorT<BailOutRecord> *)
                              &this->m_func->topFunc->nativeCodeDataAllocator,0x58bc10);
    bailOutOffset = pBVar9->bailOutOffset;
    uVar6 = pBVar9->polymorphicCacheIndex;
    BVar5 = IR::Instr::GetBailOutKind(local_40);
    BailOutRecord::BailOutRecord(this_01,bailOutOffset,uVar6,BVar5,pBVar9->bailOutFunc);
    this_01->bailOutOpcode = pBVar9->bailOutOpcode;
    pBVar9->bailOutRecord = this_01;
  }
LAB_0064f26e:
  this_02 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  uVar6 = JITTimeFunctionBody::GetSourceContextId(this_02);
  this_03 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_03);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015aabd0,AsmjsCallDebugBreakPhase,uVar6,functionId);
  if (bVar3) {
    GenerateDebugBreak(pIVar8->m_next);
  }
  return pIVar8;
}

Assistant:

IR::Instr *
LowererMD::ChangeToHelperCall(IR::Instr *callInstr, IR::JnHelperMethod helperMethod, IR::LabelInstr *labelBailOut,
                              IR::Opnd *opndBailOutArg, IR::PropertySymOpnd *propSymOpnd, bool isHelperContinuation)
{
    // Clear lazy bailout when we realize that the function cannot be reentrant in lowerer
    // since they won't have side effects
    if (callInstr->HasLazyBailOut() && !HelperMethodAttributes::CanBeReentrant(helperMethod))
    {
        callInstr->ClearLazyBailOut();
    }

    // If we want a LazyBailOut on an instruction with preop bailout, we
    // would need to have a BailOnImplicitCallPreOp on that instruction.
    // There are two ways we can go about this:
    // 1. During GlobOpt::GenerateLazyBailOut, simply use BailOnImplicitCallPreOp
    //    as the main bailout kind for that instruction. This wouldn't require
    //    any special treatment in the lowerer. However, there are a few problems:
    //      a) The instruction might have some other main bailout kind already
    //         attached.
    //         + First scenario is that the bailout kind already prevents
    //         implicit calls from happening, which leaves us to just correctly
    //         implement GlobOpt::IsLazyBailOutCurrentlyNeeded so that it doesn't
    //         return true when we already have such bailouts by incorporating
    //         GlobOpt::MayNeedBailOnImplicitCall.
    //         + Second scenario is when that bailout kind doesn't really help with
    //         preventing implicit calls. Theoretically, this shouldn't be a problem
    //         because we should be able to support bail on implicit calls if that
    //         instruction might have implicit calls. But there are some dark patterns
    //         such as NewScObjArray having a BailOnNotNative attached to it.
    //         Those will need to be rewritten before we proceed.
    // 
    //      b) We will have to change our BailOutKind bit validation because some of the
    //         kinds don't currently expect to go together with BailOnImplicitCall. This
    //         is probably less of a problem and more of just finding those cases and
    //         adding allowed bit combinations.
    //
    // 2. Just attach the lazy bailout bit onto the BailOutKind and use this opportunity
    //    to also lower an additional BailOnImplicitCallPreOp. The problem is we aren't
    //    sure if those instructions will go through `ChangeToHelperCall` at all since
    //    this right now only handles BailOutOnNotPrimitive, BailOutOnPowIntIntOverflow,
    //    and BailOutOnImplicitCalls.
    if (callInstr->HasLazyBailOut() && callInstr->HasPreOpBailOut() &&
        !BailOutInfo::IsBailOutOnImplicitCalls(callInstr->GetBailOutKind()))
    {
        AssertMsg(false, "Not implemented");
    }

    const bool hasLazyBailOut = callInstr->HasLazyBailOut();

    // Cache BailOutInfo so that we can copy it later for lazy bailout
    BailOutInfo * const bailOutInfo = callInstr->HasBailOutInfo() ? callInstr->GetBailOutInfo() : nullptr;

#if DBG
    this->m_lowerer->ReconcileWithLowererStateOnHelperCall(callInstr, helperMethod);
#endif
    IR::Instr * bailOutInstr = callInstr;
    if (callInstr->HasBailOutInfo())
    {
        const IR::BailOutKind bailOutKind = callInstr->GetBailOutKind();

        if (bailOutKind == IR::BailOutOnNotPrimitive ||
            bailOutKind == IR::BailOutOnPowIntIntOverflow)
        {
            callInstr = IR::Instr::New(callInstr->m_opcode, callInstr->m_func);
            bailOutInstr->TransferTo(callInstr);
            bailOutInstr->InsertBefore(callInstr);

            bailOutInstr->m_opcode = bailOutKind == IR::BailOutOnNotPrimitive
                                        ? Js::OpCode::BailOnNotPrimitive
                                        : Js::OpCode::BailOnPowIntIntOverflow;
            bailOutInstr->SetSrc1(opndBailOutArg);
        }
        else if (BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind))
        {
            bailOutInstr = this->m_lowerer->SplitBailOnImplicitCall(callInstr);
        }
        else
        {
            AssertMsg(BailOutInfo::HasLazyBailOut(bailOutKind), "Unexpected BailOutKind, are we adding new BailOutKind on instructions?");
        }
    }

    callInstr->m_opcode = Js::OpCode::CALL;

    IR::HelperCallOpnd *helperCallOpnd = Lowerer::CreateHelperCallOpnd(helperMethod, this->lowererMDArch.GetHelperArgsCount(), m_func);
    if (helperCallOpnd->IsDiagHelperCallOpnd())
    {
        // Load arguments for the wrapper.
        this->LoadHelperArgument(callInstr, IR::AddrOpnd::New((Js::Var)IR::GetMethodOriginalAddress(m_func->GetThreadContextInfo(), helperMethod), IR::AddrOpndKindDynamicMisc, m_func));
        this->m_lowerer->LoadScriptContext(callInstr);
    }
    callInstr->SetSrc1(helperCallOpnd);

    IR::Instr * instrRet = this->lowererMDArch.LowerCall(callInstr, 0);

    if (bailOutInstr != callInstr)
    {
        const Js::OpCode opcode = bailOutInstr->m_opcode;
        // The bailout needs to be lowered after we lower the helper call because the helper argument
        // has already been loaded. We need to drain them on AMD64 before starting another helper call
        if (opcode == Js::OpCode::BailOnNotPrimitive ||
            opcode == Js::OpCode::BailOnPowIntIntOverflow)
        {
            this->m_lowerer->LowerBailOnTrue(bailOutInstr, labelBailOut);
        }
        else if (opcode == Js::OpCode::BailOnNotEqual)
        {
            // `SplitBailOnImplicitCall` above changes the opcode to BailOnNotEqual
            Assert(BailOutInfo::IsBailOutOnImplicitCalls(bailOutInstr->GetBailOutKind()));
            this->m_lowerer->LowerBailOnEqualOrNotEqual(bailOutInstr, nullptr, labelBailOut, propSymOpnd, isHelperContinuation);
        }
        else
        {
            AssertMsg(false, "Unexpected OpCode for BailOutInstruction");
        }

        // Create BailOutInfo and BailOutRecord for helper call
        // Example:
        // We transform:
        // ```
        //  call someHelper
        //  ...
        //  call SaveAllRegisterAndBailOut (BailOutReason)
        // ```
        // to
        // ```
        //  call someHelper (LazyBailOut)
        //  ...
        //  call SaveAllRegisterAndBailOut (BailOutReason)
        // ```
        // so that the call to helper has the correct BailOutRecord filled during RegAlloc.
        if (hasLazyBailOut)
        {
            Assert(bailOutInfo != nullptr);
            Assert(!callInstr->HasBailOutInfo());
            Assert(callInstr->m_opcode == Js::OpCode::CALL);

            callInstr = callInstr->ConvertToBailOutInstrWithBailOutInfoCopy(bailOutInfo, IR::LazyBailOut);

            Assert(callInstr->HasBailOutInfo() && callInstr->GetBailOutInfo() != bailOutInfo);

            BailOutInfo *bailOutInfoCopy = callInstr->GetBailOutInfo();

            BailOutRecord *bailOutRecord = NativeCodeDataNewZ(
                this->m_func->GetNativeCodeDataAllocator(),
                BailOutRecord,
                bailOutInfoCopy->bailOutOffset,
                bailOutInfoCopy->polymorphicCacheIndex,
                callInstr->GetBailOutKind(),
                bailOutInfoCopy->bailOutFunc
            );

#if ENABLE_DEBUG_CONFIG_OPTIONS
            bailOutRecord->bailOutOpcode = bailOutInfoCopy->bailOutOpcode;
#endif

            bailOutInfoCopy->bailOutRecord = bailOutRecord;
        }
    }

#if DBG
    if (PHASE_ON(Js::AsmjsCallDebugBreakPhase, this->m_func))
    {
        this->GenerateDebugBreak(instrRet->m_next);
    }
#endif

    return instrRet;
}